

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

bool __thiscall Client::DoSend(Client *this)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  unsigned_long *puVar4;
  char *pcVar5;
  pointer piVar6;
  ssize_t sVar7;
  unsigned_long uStack_2038;
  int written;
  ulong local_2030;
  size_t to_send;
  size_t gpos;
  size_t mask;
  char buf [8192];
  Client *this_local;
  
  buf._8184_8_ = this;
  lVar3 = std::__cxx11::string::length();
  gpos = lVar3 - 1;
  to_send = this->send_buffer_gpos;
  local_2030 = 0;
  while( true ) {
    uVar1 = local_2030;
    uStack_2038 = 0x2000;
    puVar4 = std::min<unsigned_long>(&this->send_buffer_used,&stack0xffffffffffffdfc8);
    if (*puVar4 <= uVar1) break;
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)&this->send_buffer);
    buf[local_2030 - 8] = *pcVar5;
    this->send_buffer_gpos = this->send_buffer_gpos + 1 & gpos;
    local_2030 = local_2030 + 1;
  }
  piVar6 = std::unique_ptr<Client::impl_,_std::default_delete<Client::impl_>_>::operator->
                     (&this->impl);
  sVar7 = send(piVar6->sock,&mask,local_2030,0);
  iVar2 = (int)sVar7;
  if ((iVar2 < 0) || (iVar2 == -1)) {
    this_local._7_1_ = false;
  }
  else {
    this->send_buffer_gpos = to_send + (long)iVar2 & gpos;
    this->send_buffer_used = this->send_buffer_used - (long)iVar2;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Client::DoSend()
{
	char buf[8192];

	const std::size_t mask = this->send_buffer.length() - 1;
	const std::size_t gpos = this->send_buffer_gpos;

	std::size_t to_send;
	for (to_send = 0; to_send < std::min(this->send_buffer_used, sizeof(buf)); ++to_send)
	{
		buf[to_send] = this->send_buffer[this->send_buffer_gpos];
		this->send_buffer_gpos = (this->send_buffer_gpos + 1) & mask;
	}

	const int written = send(this->impl->sock, buf, to_send, 0);

	if (written < 0 || written == SOCKET_ERROR)
		return false;

	this->send_buffer_gpos = (gpos + written) & mask;
	this->send_buffer_used -= written;

	return true;
}